

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Palette.cpp
# Opt level: O2

void __thiscall sfc::Palette::save_act(Palette *this,string *path)

{
  uint uVar1;
  bool bVar2;
  pointer puVar3;
  pointer puVar4;
  long lVar5;
  long lVar6;
  pointer puVar7;
  long lVar8;
  uchar uVar9;
  uchar uVar10;
  uint *c;
  pointer this_00;
  byte_vec_t data;
  rgba_vec_t colors;
  Subpalette spp;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_c0;
  string *local_a8;
  pointer local_a0;
  _Vector_base<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  Subpalette local_80;
  
  local_a8 = path;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0,0x304,
             (allocator_type *)&local_80);
  this_00 = (this->_subpalettes).
            super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
            super__Vector_impl_data._M_start;
  local_a0 = (this->_subpalettes).
             super__Vector_base<sfc::Subpalette,_std::allocator<sfc::Subpalette>_>._M_impl.
             super__Vector_impl_data._M_finish;
  lVar8 = 0;
  do {
    if (this_00 == local_a0) break;
    Subpalette::padded(&local_80,this_00);
    Subpalette::normalized_colors((rgba_vec_t *)&local_98,&local_80);
    puVar3 = local_98._M_impl.super__Vector_impl_data._M_finish;
    lVar6 = (long)(int)lVar8 * 3;
    lVar5 = (long)(int)lVar8;
    puVar4 = local_98._M_impl.super__Vector_impl_data._M_start;
    do {
      puVar7 = puVar4;
      lVar8 = lVar5;
      if (puVar7 == local_98._M_impl.super__Vector_impl_data._M_finish) break;
      uVar1 = *puVar7;
      uVar10 = (uchar)(uVar1 >> 0x10);
      if (-1 < (int)uVar1) {
        uVar10 = '\0';
      }
      uVar9 = (uchar)(uVar1 >> 8);
      if (-1 < (int)uVar1) {
        uVar9 = '\0';
        uVar1 = 0;
      }
      local_c0._M_impl.super__Vector_impl_data._M_start[lVar6] = (uchar)uVar1;
      local_c0._M_impl.super__Vector_impl_data._M_start[lVar6 + 1] = uVar9;
      local_c0._M_impl.super__Vector_impl_data._M_start[lVar6 + 2] = uVar10;
      lVar8 = lVar5 + 1;
      lVar6 = lVar6 + 3;
      bVar2 = lVar5 < 0x100;
      lVar5 = lVar8;
      puVar4 = puVar7 + 1;
    } while (bVar2);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base(&local_98);
    Subpalette::~Subpalette(&local_80);
    this_00 = this_00 + 1;
  } while (puVar7 == puVar3);
  local_c0._M_impl.super__Vector_impl_data._M_start[0x300] = '\0';
  local_c0._M_impl.super__Vector_impl_data._M_start[0x301] = (uchar)lVar8;
  local_c0._M_impl.super__Vector_impl_data._M_start[0x302] = 0xff;
  local_c0._M_impl.super__Vector_impl_data._M_start[0x303] = 0xff;
  write_file<unsigned_char>
            (local_a8,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_c0);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_c0);
  return;
}

Assistant:

void Palette::save_act(const std::string& path) const {
  byte_vec_t data((256 * 3) + 4);
  int count = 0;

  for (const auto& sp : _subpalettes) {
    Subpalette spp = sp.padded();
    rgba_vec_t colors = spp.normalized_colors();
    for (const auto& c : colors) {
      rgba_color rgba(c);
      data[count * 3 + 0] = rgba.r;
      data[count * 3 + 1] = rgba.g;
      data[count * 3 + 2] = rgba.b;
      if (++count > 256)
        goto done;
    }
  }

done:
  data[0x300] = 0x00;
  data[0x301] = count & 0xff;
  data[0x302] = data[0x303] = 0xff;
  write_file(path, data);
}